

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qxcbscreen.cpp
# Opt level: O0

void __thiscall QXcbScreen::~QXcbScreen(QXcbScreen *this)

{
  QEdidParser *in_RDI;
  
  (in_RDI->identifier).d.d = (Data *)&PTR__QXcbScreen_0027f7b8;
  (in_RDI->manufacturer).d.d = (Data *)&PTR__QXcbScreen_0027f8b8;
  QEdidParser::~QEdidParser(in_RDI);
  std::unique_ptr<QXcbCursor,_std::default_delete<QXcbCursor>_>::~unique_ptr
            ((unique_ptr<QXcbCursor,_std::default_delete<QXcbCursor>_> *)in_RDI);
  QColorSpace::~QColorSpace((QColorSpace *)&(in_RDI->tables).d.size);
  QString::~QString((QString *)0x1cf3d2);
  QList<unsigned_int>::~QList((QList<unsigned_int> *)0x1cf3e0);
  QList<unsigned_int>::~QList((QList<unsigned_int> *)0x1cf3ee);
  QNativeInterface::Private::QXcbScreen::~QXcbScreen((QXcbScreen *)&in_RDI->manufacturer);
  QPlatformScreen::~QPlatformScreen((QPlatformScreen *)in_RDI);
  return;
}

Assistant:

QXcbScreen::~QXcbScreen()
{
}